

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::BlockDropout::forward_impl
          (BlockDropout *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  float local_9c;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_58;
  undefined1 extraout_var [56];
  
  fVar1 = this->dropout_probability;
  auVar4._0_8_ = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (rndeng);
  auVar4._8_56_ = extraout_var;
  fVar2 = this->dropout_probability;
  local_9c = 0.0;
  if (fVar2 != 1.0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = 1.0 - (double)fVar1;
    uVar3 = vcmpsd_avx512f(auVar4._0_16_,auVar5,1);
    local_9c = (float)((double)((ulong)((byte)uVar3 & 1) * 0x3ff0000000000000) /
                      (1.0 - (double)fVar2));
  }
  if ((fVar2 <= 1.0) && (0.0 <= fVar2)) {
    *(float *)(this->super_Node).aux_mem = local_9c;
    Tensor::operator*(&local_78,
                      *(xs->
                       super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator*(&local_58,
              (MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>> *)
              &local_78,&local_9c);
    Tensor::operator*(&local_98,fx);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>>
              (&local_98,&local_58);
    return;
  }
  __assert_fail("false && \"dropout probability must be in the range [0, 1]\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x209,
                "virtual void cnn::BlockDropout::forward_impl(const vector<const Tensor *> &, Tensor &) const"
               );
}

Assistant:

void BlockDropout::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BlockDropout not yet implemented for CUDA");
#else
  bernoulli_distribution distribution(1.0 - dropout_probability);
  float block_multiplier = distribution(*rndeng)? 1.0 : 0.0;
  block_multiplier = 
    dropout_probability == 1.0? 0.0 : block_multiplier / (1.0 - dropout_probability);
  if (dropout_probability > 1.0 || dropout_probability < 0.0) {
    assert(false && "dropout probability must be in the range [0, 1]");
  }
  *(static_cast<float*>(aux_mem)) = block_multiplier;
  (*fx) = **xs[0] * block_multiplier;
#endif
}